

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseTypeModuleField(WastParser *this,Module *module)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  Result RVar2;
  pointer pFVar3;
  pointer pSVar4;
  pointer pAVar5;
  pointer pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_258;
  Enum local_24c;
  Enum local_248;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_244;
  allocator<char> local_243;
  allocator<char> local_242;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string asStack_220 [32];
  string asStack_200 [32];
  iterator local_1e0;
  size_type local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  Enum local_1b4;
  __single_object array_type;
  __single_object struct_type;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string asStack_130 [32];
  iterator local_110;
  size_type local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  Enum local_e8;
  Enum local_e4;
  undefined1 local_e0 [8];
  BindingHash bindings;
  __single_object func_type;
  Location loc;
  undefined1 local_78 [8];
  string name;
  Location local_50;
  undefined1 local_30 [8];
  __single_object field;
  Module *module_local;
  WastParser *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl._4_4_ = Expect(this,Lpar);
  bVar1 = Failed(field._M_t.
                 super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                 .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation(&local_50,this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_30);
  name.field_2._12_4_ = Expect(this,Type);
  bVar1 = Failed((Result)name.field_2._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    name.field_2._8_4_ = 1;
    goto LAB_001a3c23;
  }
  std::__cxx11::string::string((string *)local_78);
  ParseBindVarOpt(this,(string *)local_78);
  RVar2 = Expect(this,Lpar);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    name.field_2._8_4_ = 1;
    goto LAB_001a3c1a;
  }
  GetLocation((Location *)&func_type,this);
  bVar1 = Match(this,First_RefKind);
  if (bVar1) {
    std::make_unique<wabt::FuncType,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
    BindingHash::BindingHash((BindingHash *)local_e0);
    pFVar3 = std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::operator->
                       ((unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> *)
                        &bindings.
                         super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                         ._M_h._M_single_bucket);
    local_e4 = (Enum)ParseFuncSignature(this,&pFVar3->sig,(BindingHash *)local_e0);
    bVar1 = Failed((Result)local_e4);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      name.field_2._8_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"param",&local_151);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_130,"result",&local_152);
      local_110 = &local_150;
      local_108 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_153);
      __l_00._M_len = local_108;
      __l_00._M_array = local_110;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_100,__l_00,&local_153);
      local_e8 = (Enum)ErrorIfLpar(this,&local_100,(char *)0x0);
      bVar1 = Failed((Result)local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_153);
      local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
      do {
        local_268 = local_268 + -1;
        std::__cxx11::string::~string((string *)local_268);
      } while (local_268 != &local_150);
      std::allocator<char>::~allocator(&local_152);
      std::allocator<char>::~allocator(&local_151);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        name.field_2._8_4_ = 1;
      }
      else {
        pTVar6 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                 ::operator->((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                               *)local_30);
        std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
                  ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)&pTVar6->type
                   ,(unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> *)
                    &bindings.
                     super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                     ._M_h._M_single_bucket);
        name.field_2._8_4_ = 0;
      }
    }
    BindingHash::~BindingHash((BindingHash *)local_e0);
    std::unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_>::~unique_ptr
              ((unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> *)
               &bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
joined_r0x001a3704:
    if (name.field_2._8_4_ == 0) {
      local_248 = (Enum)Expect(this,Rpar);
      bVar1 = Failed((Result)local_248);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        name.field_2._8_4_ = 1;
      }
      else {
        local_24c = (Enum)Expect(this,Rpar);
        bVar1 = Failed((Result)local_24c);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          name.field_2._8_4_ = 1;
        }
        else {
          std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
          unique_ptr(&local_258,
                     (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                      *)local_30);
          Module::AppendField(module,&local_258);
          std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
          ~unique_ptr(&local_258);
          Result::Result((Result *)((long)&this_local + 4),Ok);
          name.field_2._8_4_ = 1;
        }
      }
    }
  }
  else {
    bVar1 = Match(this,Struct);
    if (bVar1) {
      bVar1 = Features::gc_enabled(&this->options_->features);
      if (bVar1) {
        std::make_unique<wabt::StructType,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe80);
        pSVar4 = std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::
                 operator->((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
                            &stack0xfffffffffffffe80);
        RVar2 = ParseFieldList(this,&pSVar4->fields);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          pTVar6 = std::
                   unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
                   operator->((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                               *)local_30);
          std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
                    ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)
                     &pTVar6->type,
                     (unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
                     &stack0xfffffffffffffe80);
        }
        name.field_2._9_3_ = 0;
        name.field_2._M_local_buf[8] = bVar1;
        std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::~unique_ptr
                  ((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
                   &stack0xfffffffffffffe80);
        goto joined_r0x001a3704;
      }
      struct_type._M_t.
      super___uniq_ptr_impl<wabt::StructType,_std::default_delete<wabt::StructType>_>._M_t.
      super__Tuple_impl<0UL,_wabt::StructType_*,_std::default_delete<wabt::StructType>_>.
      super__Head_base<0UL,_wabt::StructType_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::StructType,_std::default_delete<wabt::StructType>,_true,_true>)
           (__uniq_ptr_data<wabt::StructType,_std::default_delete<wabt::StructType>,_true,_true>)
           func_type._M_t.
           super___uniq_ptr_impl<wabt::FuncType,_std::default_delete<wabt::FuncType>_>._M_t.
           super__Tuple_impl<0UL,_wabt::FuncType_*,_std::default_delete<wabt::FuncType>_>.
           super__Head_base<0UL,_wabt::FuncType_*,_false>._M_head_impl;
      Error(this,0x258aa4);
      Result::Result((Result *)((long)&this_local + 4),Error);
      name.field_2._8_4_ = 1;
    }
    else {
      bVar1 = Match(this,Array);
      if (bVar1) {
        bVar1 = Features::gc_enabled(&this->options_->features);
        if (!bVar1) {
          array_type._M_t.
          super___uniq_ptr_impl<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>._M_t.
          super__Tuple_impl<0UL,_wabt::ArrayType_*,_std::default_delete<wabt::ArrayType>_>.
          super__Head_base<0UL,_wabt::ArrayType_*,_false>._M_head_impl =
               (__uniq_ptr_data<wabt::ArrayType,_std::default_delete<wabt::ArrayType>,_true,_true>)
               (__uniq_ptr_data<wabt::ArrayType,_std::default_delete<wabt::ArrayType>,_true,_true>)
               func_type._M_t.
               super___uniq_ptr_impl<wabt::FuncType,_std::default_delete<wabt::FuncType>_>._M_t.
               super__Tuple_impl<0UL,_wabt::FuncType_*,_std::default_delete<wabt::FuncType>_>.
               super__Head_base<0UL,_wabt::FuncType_*,_false>._M_head_impl;
          Error(this,0x25312b);
        }
        std::make_unique<wabt::ArrayType,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe50);
        pAVar5 = std::unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>::operator->
                           ((unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_> *)
                            &stack0xfffffffffffffe50);
        local_1b4 = (Enum)ParseField(this,&pAVar5->field);
        bVar1 = Failed((Result)local_1b4);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          pTVar6 = std::
                   unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
                   operator->((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                               *)local_30);
          std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
                    ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)
                     &pTVar6->type,
                     (unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_> *)
                     &stack0xfffffffffffffe50);
        }
        name.field_2._9_3_ = 0;
        name.field_2._M_local_buf[8] = bVar1;
        std::unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>::~unique_ptr
                  ((unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_> *)
                   &stack0xfffffffffffffe50);
        goto joined_r0x001a3704;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"func",&local_241);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_220,"struct",&local_242);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_200,"array",&local_243);
      local_1e0 = &local_240;
      local_1d8 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_244);
      __l._M_len = local_1d8;
      __l._M_array = local_1e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1d0,__l,&local_244);
      this_local._4_4_ = ErrorExpected(this,&local_1d0,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_244);
      local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0;
      do {
        local_290 = local_290 + -1;
        std::__cxx11::string::~string((string *)local_290);
      } while (local_290 != &local_240);
      std::allocator<char>::~allocator(&local_243);
      std::allocator<char>::~allocator(&local_242);
      std::allocator<char>::~allocator(&local_241);
      name.field_2._8_4_ = 1;
    }
  }
LAB_001a3c1a:
  std::__cxx11::string::~string((string *)local_78);
LAB_001a3c23:
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            ((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
             local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseTypeModuleField(Module* module) {
  WABT_TRACE(ParseTypeModuleField);
  EXPECT(Lpar);
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  EXPECT(Type);

  std::string name;
  ParseBindVarOpt(&name);
  EXPECT(Lpar);
  Location loc = GetLocation();

  if (Match(TokenType::Func)) {
    auto func_type = std::make_unique<FuncType>(name);
    BindingHash bindings;
    CHECK_RESULT(ParseFuncSignature(&func_type->sig, &bindings));
    CHECK_RESULT(ErrorIfLpar({"param", "result"}));
    field->type = std::move(func_type);
  } else if (Match(TokenType::Struct)) {
    if (!options_->features.gc_enabled()) {
      Error(loc, "struct not allowed");
      return Result::Error;
    }
    auto struct_type = std::make_unique<StructType>(name);
    CHECK_RESULT(ParseFieldList(&struct_type->fields));
    field->type = std::move(struct_type);
  } else if (Match(TokenType::Array)) {
    if (!options_->features.gc_enabled()) {
      Error(loc, "array type not allowed");
    }
    auto array_type = std::make_unique<ArrayType>(name);
    CHECK_RESULT(ParseField(&array_type->field));
    field->type = std::move(array_type);
  } else {
    return ErrorExpected({"func", "struct", "array"});
  }

  EXPECT(Rpar);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}